

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O3

version_constant __thiscall setup::version::next(version *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 *puVar3;
  version_constant *pvVar4;
  difference_type __d_1;
  ulong uVar5;
  difference_type __d;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  uVar5 = 2;
  puVar1 = &(anonymous_namespace)::legacy_versions;
  do {
    uVar6 = uVar5 >> 1;
    puVar2 = puVar1 + uVar6 * 4 + 4;
    uVar5 = ~uVar6 + uVar5;
    if (this->value < *(uint *)(puVar1 + uVar6 * 4 + 2)) {
      puVar2 = puVar1;
      uVar5 = uVar6;
    }
    puVar1 = puVar2;
  } while (0 < (long)uVar5);
  if (puVar2 != (undefined8 *)&(anonymous_namespace)::versions) {
    pvVar4 = (version_constant *)(puVar2 + 2);
    do {
      if (*(_WordT *)(pvVar4 + 2) == (this->variant)._flags.super__Base_bitset<1UL>._M_w)
      goto LAB_00143412;
      bVar8 = pvVar4 != &DAT_00174160;
      pvVar4 = pvVar4 + 8;
    } while (bVar8);
  }
  puVar3 = &(anonymous_namespace)::versions;
  uVar5 = 0x72;
  do {
    uVar6 = uVar5 >> 1;
    lVar7 = uVar6 * 0x50;
    if (*(uint *)(puVar3 + lVar7 + 0x40) <= this->value) {
      uVar6 = ~uVar6 + uVar5;
      puVar3 = puVar3 + lVar7 + 0x50;
    }
    uVar5 = uVar6;
  } while (0 < (long)uVar6);
  if (puVar3 != &std::__ioinit) {
    pvVar4 = (version_constant *)(puVar3 + 0x40);
    do {
      if (*(_WordT *)(pvVar4 + 2) == (this->variant)._flags.super__Base_bitset<1UL>._M_w) {
LAB_00143412:
        return *pvVar4;
      }
      bVar8 = pvVar4 != (version_constant *)&DAT_00176500;
      pvVar4 = pvVar4 + 0x14;
    } while (bVar8);
  }
  return 0;
}

Assistant:

version_constant version::next() {
	
	const known_legacy_version * legacy_end = boost::end(legacy_versions);
	const known_legacy_version * legacy_result;
	legacy_result = std::upper_bound(boost::begin(legacy_versions), legacy_end, value);
	while(legacy_result != legacy_end && legacy_result->variant != variant) {
		legacy_result++;
	}
	if(legacy_result != legacy_end) {
		return legacy_result->version;
	}
	 
	const known_version * end = boost::end(versions);
	const known_version * result = std::upper_bound(boost::begin(versions), end, value);
	while(result != end && result->variant != variant) {
		result++;
	}
	if(result != end) {
		return result->version;
	}
	
	return 0;
}